

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLinActuator.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLinActuator::UpdateTime(ChLinkLinActuator *this,double mytime)

{
  ChMarker *pCVar1;
  ChMarker *pCVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  ulong *puVar6;
  ChQuaternion<double> *pCVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ChMatrix33<double> ma;
  ChMatrix33<double> local_a0;
  double local_58;
  double dStack_50;
  Coordsys local_48;
  
  ChLinkLockLock::UpdateTime(&this->super_ChLinkLockLock,mytime);
  pCVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  pCVar1->motion_type = M_MOTION_EXTERNAL;
  ChMatrix33<double>::ChMatrix33(&local_a0,&(pCVar1->abs_frame).super_ChFrame<double>.coord.rot);
  pCVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1;
  pCVar2 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  dVar15 = (pCVar2->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
  dVar3 = (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data[1] -
          (pCVar2->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
  dVar16 = (pCVar2->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  dVar4 = (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data[0] - dVar15;
  dVar33 = (pCVar1->abs_frame).super_ChFrame<double>.coord.pos.m_data[2] - dVar16;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar3 * dVar3;
  auVar9 = vfmadd231sd_fma(auVar24,auVar17,auVar17);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar33;
  auVar9 = vfmadd231sd_fma(auVar9,auVar27,auVar27);
  auVar9 = vsqrtsd_avx(auVar9,auVar9);
  dVar31 = auVar9._0_8_;
  dVar32 = 1.0 / dVar31;
  bVar5 = 2.2250738585072014e-308 <= dVar31;
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar9._0_8_ = (double)((ulong)bVar5 * (long)(dVar4 * dVar32) + (ulong)!bVar5 * 0x3ff0000000000000
                         );
  auVar9._8_8_ = 0;
  dVar3 = (double)((ulong)bVar5 * (long)(dVar3 * dVar32));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar4 = (double)((ulong)bVar5 * (long)(dVar33 * dVar32));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar4;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  if (((((local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] ==
          auVar9._0_8_) &&
        (!NAN(local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
             ) && !NAN(auVar9._0_8_))) &&
       (local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] ==
        dVar3)) &&
      ((!NAN(local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4])
        && !NAN(dVar3) &&
       (local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] ==
        dVar4)))) &&
     (!NAN(local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7])
      && !NAN(dVar4))) {
    if ((auVar9._0_8_ != 1.0) || (NAN(auVar9._0_8_))) {
      puVar6 = &VECT_X;
    }
    else {
      puVar6 = &VECT_Y;
    }
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *puVar6;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = puVar6[1];
    auVar35._8_8_ = 0;
    auVar35._0_8_ = puVar6[2];
  }
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar4 * auVar28._0_8_;
  auVar24 = vfmsub231sd_fma(auVar38,auVar10,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = auVar35._0_8_ * auVar9._0_8_;
  auVar17 = vfmsub231sd_fma(auVar36,auVar11,auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar3 * auVar25._0_8_;
  auVar25 = vfmsub231sd_fma(auVar26,auVar9,auVar28);
  dVar33 = auVar17._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar33 * dVar33;
  auVar17 = vfmadd231sd_fma(auVar29,auVar24,auVar24);
  auVar17 = vfmadd231sd_fma(auVar17,auVar25,auVar25);
  auVar17 = vsqrtsd_avx(auVar17,auVar17);
  dVar32 = 1.0 / auVar17._0_8_;
  bVar5 = 2.2250738585072014e-308 <= auVar17._0_8_;
  auVar12._0_8_ =
       (double)((ulong)bVar5 * (long)(auVar24._0_8_ * dVar32) + (ulong)!bVar5 * 0x3ff0000000000000);
  auVar12._8_8_ = 0;
  dVar33 = (double)((ulong)bVar5 * (long)(dVar33 * dVar32));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar33;
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (double)((ulong)bVar5 * (long)(auVar25._0_8_ * dVar32));
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar4 * auVar12._0_8_;
  auVar17 = vfmsub231sd_fma(auVar37,auVar9,auVar14);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       dVar3 * local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
  auVar11 = vfmsub231sd_fma(auVar30,auVar13,auVar11);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar33 * auVar9._0_8_;
  auVar24 = vfmsub231sd_fma(auVar39,auVar10,auVar12);
  dVar34 = auVar17._0_8_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar34 * dVar34;
  auVar10 = vfmadd231sd_fma(auVar40,auVar11,auVar11);
  auVar10 = vfmadd231sd_fma(auVar10,auVar24,auVar24);
  auVar10 = vsqrtsd_avx(auVar10,auVar10);
  dVar32 = 1.0 / auVar10._0_8_;
  bVar5 = 2.2250738585072014e-308 <= auVar10._0_8_;
  local_48.pos.m_data[2] = 0.0;
  dVar8 = (double)((ulong)bVar5 * (long)(auVar11._0_8_ * dVar32) +
                  (ulong)!bVar5 * 0x3ff0000000000000);
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (double)((ulong)bVar5 * (long)(dVar34 * dVar32));
  dVar32 = (double)((ulong)bVar5 * (long)(auVar24._0_8_ * dVar32));
  local_48.pos.m_data[0] = 0.0;
  local_48.pos.m_data[1] = 0.0;
  if (&(pCVar2->abs_frame).super_ChFrame<double>.coord != &local_48) {
    local_48.pos.m_data[0] = dVar15;
    local_48.pos.m_data[1] = (pCVar2->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
    local_48.pos.m_data[2] = dVar16;
  }
  local_58 = (pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dStack_50 = (pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  dVar16 = (pCVar2->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  dVar15 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] +
           auVar9._0_8_ +
           local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar9._0_8_;
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar8;
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar12._0_8_;
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar3;
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar33;
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar4;
  local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar32;
  if (0.0 <= dVar15) {
    dVar15 = dVar15 + 1.0;
    if (dVar15 < 0.0) {
      local_48.rot.m_data[3] = sqrt(dVar15);
    }
    else {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar15;
      auVar9 = vsqrtsd_avx(auVar19,auVar19);
      local_48.rot.m_data[3] = auVar9._0_8_;
    }
    local_48.rot.m_data[0] = local_48.rot.m_data[3] * 0.5;
    local_48.rot.m_data[3] = 0.5 / local_48.rot.m_data[3];
    local_48.rot.m_data[1] = (dVar32 - dVar33) * local_48.rot.m_data[3];
    local_48.rot.m_data[2] = (auVar12._0_8_ - dVar4) * local_48.rot.m_data[3];
    local_48.rot.m_data[3] = (dVar3 - dVar8) * local_48.rot.m_data[3];
    goto LAB_0059807b;
  }
  if (local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] <=
      auVar9._0_8_) {
    if (auVar9._0_8_ <
        local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
    goto LAB_00597e53;
    dVar15 = ((auVar9._0_8_ -
              local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
              ) - local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[8]) + 1.0;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = dVar15;
      auVar9 = vsqrtsd_avx(auVar21,auVar21);
      dVar15 = auVar9._0_8_;
    }
    local_48.rot.m_data[0] = dVar32 - dVar33;
    local_48.rot.m_data[1] = dVar15 * 0.5;
    dVar15 = 0.5 / dVar15;
    local_48.rot.m_data[2] = (dVar3 + dVar8) * dVar15;
    local_48.rot.m_data[3] = (dVar4 + auVar12._0_8_) * dVar15;
  }
  else if (local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] <
           local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) {
LAB_00597e53:
    dVar15 = ((local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8] - auVar9._0_8_) -
             local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4])
             + 1.0;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar15;
      auVar9 = vsqrtsd_avx(auVar20,auVar20);
      dVar15 = auVar9._0_8_;
    }
    local_48.rot.m_data[0] = dVar3 - dVar8;
    local_48.rot.m_data[3] = dVar15 * 0.5;
    dVar15 = 0.5 / dVar15;
    local_48.rot.m_data[1] = (dVar4 + auVar12._0_8_) * dVar15;
    local_48.rot.m_data[2] = (dVar33 + dVar32) * dVar15;
  }
  else {
    dVar15 = ((local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4] - local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8]) - auVar9._0_8_) + 1.0;
    if (dVar15 < 0.0) {
      dVar15 = sqrt(dVar15);
    }
    else {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = dVar15;
      auVar9 = vsqrtsd_avx(auVar18,auVar18);
      dVar15 = auVar9._0_8_;
    }
    local_48.rot.m_data[0] = auVar12._0_8_ - dVar4;
    local_48.rot.m_data[2] = dVar15 * 0.5;
    dVar15 = 0.5 / dVar15;
    local_48.rot.m_data[3] = (dVar33 + dVar32) * dVar15;
    local_48.rot.m_data[1] = (dVar3 + dVar8) * dVar15;
  }
  local_48.rot.m_data[0] = local_48.rot.m_data[0] * dVar15;
LAB_0059807b:
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,&local_48);
  pCVar1 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0] = local_58;
  (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1] = dStack_50;
  (pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2] = dVar16;
  dVar16 = DAT_00b689a0;
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2880)) {
    (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = dVar16;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = DAT_00b689a8;
  }
  dVar16 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = dVar16 + this->offset;
  dVar16 = DAT_00b689a0;
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2848)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = dVar16;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_00b689a8;
  }
  dVar16 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = dVar16;
  dVar16 = DAT_00b689a0;
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2810)) {
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = dVar16;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] = DAT_00b689a8;
  }
  dVar16 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = dVar16;
  if (1e-06 < dVar31) {
    dVar3 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data[1];
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data[2];
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar3 * dVar3;
    auVar9 = vfmadd231sd_fma(auVar22,auVar23,auVar23);
    auVar9 = vsqrtsd_avx(auVar9,auVar9);
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] =
         dVar16 - (auVar9._0_8_ * auVar9._0_8_) / dVar31;
  }
  dVar4 = DAT_00b68868;
  dVar3 = DAT_00b68860;
  dVar16 = DAT_00b68858;
  pCVar7 = &(this->super_ChLinkLockLock).deltaC.rot;
  if (pCVar7 != (ChQuaternion<double> *)&QUNIT) {
    pCVar7->m_data[0] = QUNIT;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[1] = dVar16;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[2] = dVar3;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[3] = dVar4;
  }
  dVar4 = DAT_00b68848;
  dVar3 = DAT_00b68840;
  dVar16 = DAT_00b68838;
  pCVar7 = &(this->super_ChLinkLockLock).deltaC_dt.rot;
  if (pCVar7 != (ChQuaternion<double> *)&QNULL) {
    pCVar7->m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[1] = dVar16;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[2] = dVar3;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[3] = dVar4;
  }
  dVar4 = DAT_00b68848;
  dVar3 = DAT_00b68840;
  dVar16 = DAT_00b68838;
  pCVar7 = &(this->super_ChLinkLockLock).deltaC_dtdt.rot;
  if (pCVar7 != (ChQuaternion<double> *)&QNULL) {
    pCVar7->m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[1] = dVar16;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[2] = dVar3;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[3] = dVar4;
  }
  return;
}

Assistant:

void ChLinkLinActuator::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLockLock::UpdateTime(mytime);

    // Move (well, rotate...) marker 2 to align it in actuator direction

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    ChMatrix33<> ma(marker2->GetAbsCoord().rot);

    Vector absdist = Vsub(marker1->GetAbsCoord().pos, marker2->GetAbsCoord().pos);

    Vector mx = Vnorm(absdist);

    Vector my = ma.Get_A_Yaxis();
    if (Vequal(mx, my)) {
        if (mx.x() == 1.0)
            my = VECT_Y;
        else
            my = VECT_X;
    }
    Vector mz = Vnorm(Vcross(mx, my));
    my = Vnorm(Vcross(mz, mx));

    ma.Set_A_axis(mx, my, mz);

    Coordsys newmarkpos;
    ChVector<> oldpos = marker2->GetPos();  // backup to avoid numerical err.accumulation
    newmarkpos.pos = marker2->GetAbsCoord().pos;
    newmarkpos.rot = ma.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // rotate "main" marker2 into tangent position (may add err.accumulation)
    marker2->SetPos(oldpos);                // backup to avoid numerical err.accumulation

    // imposed relative positions/speeds
    deltaC.pos = VNULL;
    deltaC.pos.x() = dist_funct->Get_y(ChTime) + offset;  // distance is always on M2 'X' axis

    deltaC_dt.pos = VNULL;
    deltaC_dt.pos.x() = dist_funct->Get_y_dx(ChTime);  // distance speed

    deltaC_dtdt.pos = VNULL;
    deltaC_dtdt.pos.x() = dist_funct->Get_y_dxdx(ChTime);  // distance acceleration

    // add also the centripetal acceleration if distance vector's rotating,
    // as centripetal acc. of point sliding on a sphere surface.
    Vector tang_speed = GetRelM_dt().pos;
    tang_speed.x() = 0;                     // only z-y coords in relative tang speed vector
    double len_absdist = Vlength(absdist);  // don't divide by zero
    if (len_absdist > 1E-6)
        deltaC_dtdt.pos.x() -= pow(Vlength(tang_speed), 2) / Vlength(absdist);  // An = Adelta -(Vt^2 / r)

    deltaC.rot = QUNIT;  // no relative rotations imposed!
    deltaC_dt.rot = QNULL;
    deltaC_dtdt.rot = QNULL;
}